

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
toml::ok<std::__cxx11::string&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  value_type *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = in_RDI;
  std::__cxx11::string::string(unaff_retaddr,in_RDI);
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::success
            ((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(this);
  return (success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_RDI;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}